

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

uint16_t byteutil_read_uint16(uint8_t **buffer,size_t byteLen)

{
  ushort *puVar1;
  LOGGER_LOG p_Var2;
  uint16_t uVar3;
  
  if ((buffer == (uint8_t **)0x0) ||
     (puVar1 = (ushort *)*buffer, byteLen < 2 || puVar1 == (ushort *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_client.c"
                ,"byteutil_read_uint16",0x9d,1,"byteutil_read_uint16 == NULL or less than 2");
    }
  }
  else {
    uVar3 = *puVar1 << 8 | *puVar1 >> 8;
    *buffer = (uint8_t *)(puVar1 + 1);
  }
  return uVar3;
}

Assistant:

static uint16_t byteutil_read_uint16(uint8_t** buffer, size_t byteLen)
{
    uint16_t result = 0;
    if (buffer != NULL && *buffer != NULL && byteLen >= 2)
    {
        result = 256 * (**buffer) + (*(*buffer + 1));
        *buffer += 2; // Move the ptr
    }
    else
    {
        LogError("byteutil_read_uint16 == NULL or less than 2");
    }
    return result;
}